

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  code *pcVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  undefined1 uVar8;
  ImDrawList *this;
  ImGuiItemFlags *pIVar9;
  ImGuiContext *g;
  
  pIVar6 = GImGui;
  if ((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
       (GImGui->HoveredIdAllowOverlap == true)) &&
      (pIVar3 = GImGui->CurrentWindow, GImGui->HoveredWindow == pIVar3)) &&
     ((IVar1 = GImGui->ActiveId, IVar1 == id || IVar1 == 0 || (GImGui->ActiveIdAllowOverlap == true)
      ))) {
    bVar7 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar7) {
      if (((pIVar6->NavWindow == (ImGuiWindow *)0x0) ||
          (pIVar4 = pIVar6->NavWindow->RootWindow, pIVar4 == (ImGuiWindow *)0x0)) ||
         ((pIVar4->WasActive != true ||
          ((pIVar4 == pIVar3->RootWindow || ((pIVar4->Flags & 0xc000000) == 0)))))) {
        if (id == 0) {
          pIVar9 = &pIVar6->CurrentItemFlags;
          if ((pIVar6->LastItemData).ID == 0) {
            pIVar9 = &(pIVar6->LastItemData).InFlags;
          }
          if ((*pIVar9 & 4) == 0) goto LAB_0010d76d;
        }
        else {
          pIVar6->HoveredId = id;
          pIVar6->HoveredIdAllowOverlap = false;
          pIVar6->HoveredIdUsingMouseWheel = false;
          IVar2 = pIVar6->HoveredIdPreviousFrame;
          if (IVar2 != id) {
            pIVar6->HoveredIdTimer = 0.0;
            pIVar6->HoveredIdNotActiveTimer = 0.0;
          }
          pIVar9 = &pIVar6->CurrentItemFlags;
          if ((pIVar6->LastItemData).ID == id) {
            pIVar9 = &(pIVar6->LastItemData).InFlags;
          }
          if ((*pIVar9 & 4) == 0) {
            if ((IVar2 == id) && (pIVar6->DebugItemPickerActive != false)) {
              this = GetViewportDrawList(*(pIVar6->Viewports).Data,1,"##Foreground");
              ImDrawList::AddRect(this,&bb->Min,&bb->Max,0xff00ffff,0.0,0,1.0);
            }
            if (pIVar6->DebugItemPickerBreakId == id) {
              pcVar5 = (code *)swi(3);
              uVar8 = (*pcVar5)();
              return (bool)uVar8;
            }
LAB_0010d76d:
            return (bool)(pIVar6->NavDisableMouseHover ^ 1);
          }
        }
        if (IVar1 == id) {
          SetActiveID(0,(ImGuiWindow *)0x0);
        }
      }
      pIVar6->HoveredIdDisabled = true;
    }
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (!IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we perform the test in ItemAdd(), but that would incur a small runtime cost.
        // #define IMGUI_DEBUG_TOOL_ITEM_PICKER_EX in imconfig.h if you want this check to also be performed in ItemAdd().
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        if (g.DebugItemPickerBreakId == id)
            IM_DEBUG_BREAK();
    }

    if (g.NavDisableMouseHover)
        return false;

    return true;
}